

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void d68000_dbra(m68k_info *info)

{
  uint displacement;
  ulong uVar1;
  
  uVar1 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
  displacement = 0xaaaa;
  if (uVar1 + 2 <= info->code_len) {
    displacement = (uint)(ushort)(*(ushort *)(info->code + uVar1) << 8 |
                                 *(ushort *)(info->code + uVar1) >> 8);
  }
  info->pc = info->pc + 2;
  build_dbxx(info,0x4b,(int)(short)displacement & 0xffff0000U | displacement,displacement);
  return;
}

Assistant:

static void d68000_dbra(m68k_info *info)
{
	build_dbxx(info, M68K_INS_DBRA, 0, make_int_16(read_imm_16(info)));
}